

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalInsert::GetGlobalSinkState(PhysicalInsert *this,ClientContext *context)

{
  long lVar1;
  Catalog *this_00;
  SchemaCatalogEntry *schema;
  CatalogTransaction transaction;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  type info;
  InsertGlobalState *this_01;
  ClientContext *in_RDX;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_60;
  CatalogTransaction local_58;
  
  lVar1._0_1_ = (context->config).enable_progress_bar;
  lVar1._1_1_ = (context->config).print_progress_bar;
  lVar1._2_2_ = *(undefined2 *)&(context->config).field_0x92;
  lVar1._4_4_ = (context->config).wait_time;
  if (lVar1 == 0) {
    local_60.ptr = (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets;
  }
  else {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
               &(context->config).system_progress_bar_disable_reason);
    this_00 = *(Catalog **)((context->config).system_progress_bar_disable_reason + 0xd8);
    Catalog::GetCatalogTransaction(&local_58,this_00,in_RDX);
    schema = (SchemaCatalogEntry *)(context->config).system_progress_bar_disable_reason;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)&(context->config).enable_progress_bar);
    transaction.context.ptr = local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.transaction.ptr = local_58.transaction.ptr;
    transaction.transaction_id = local_58.transaction_id;
    transaction.start_time = local_58.start_time;
    local_60.ptr = (TableCatalogEntry *)Catalog::CreateTable(this_00,transaction,schema,info);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_60);
  }
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_60);
  table.ptr = local_60.ptr;
  this_01 = (InsertGlobalState *)operator_new(0x100);
  InsertGlobalState::InsertGlobalState
            (this_01,in_RDX,(vector<duckdb::LogicalType,_true> *)&context->registered_state,
             (DuckTableEntry *)table.ptr);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)this_01;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		table = &catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info)
		             ->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	auto result = make_uniq<InsertGlobalState>(context, GetTypes(), table->Cast<DuckTableEntry>());
	return std::move(result);
}